

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnGlobalGetExpr
          (BinaryReaderInterp *this,Index global_index)

{
  Index index;
  bool bVar1;
  Location local_a8;
  Var local_88;
  Location local_40;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index global_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = global_index;
  pBStack_18 = this;
  GetLocation(&local_40,this);
  index = local_1c;
  GetLocation(&local_a8,this);
  Var::Var(&local_88,index,&local_a8);
  local_20 = (Enum)SharedValidator::OnGlobalGet(&this->validator_,&local_40,&local_88);
  bVar1 = Failed((Result)local_20);
  Var::~Var(&local_88);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,GlobalGet,local_1c);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnGlobalGetExpr(Index global_index) {
  CHECK_RESULT(
      validator_.OnGlobalGet(GetLocation(), Var(global_index, GetLocation())));
  istream_.Emit(Opcode::GlobalGet, global_index);
  return Result::Ok;
}